

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaMethodBuilder::setRevision(QMetaMethodBuilder *this,int revision)

{
  QMetaMethodBuilderPrivate *pQVar1;
  int in_ESI;
  QMetaMethodBuilder *in_RDI;
  QMetaMethodBuilderPrivate *d;
  
  pQVar1 = d_func(in_RDI);
  if (pQVar1 != (QMetaMethodBuilderPrivate *)0x0) {
    pQVar1->revision = in_ESI;
    if (in_ESI == 0) {
      pQVar1->attributes = pQVar1->attributes & 0xffffff7f;
    }
    else {
      pQVar1->attributes = pQVar1->attributes | 0x80;
    }
  }
  return;
}

Assistant:

void QMetaMethodBuilder::setRevision(int revision)
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d) {
        d->revision = revision;
        if (revision)
            d->attributes |= MethodRevisioned;
        else
            d->attributes &= ~MethodRevisioned;
    }
}